

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O0

double dynamicgraph::signal_io<double>::cast(istringstream *iss)

{
  bool bVar1;
  double dVar2;
  format fmt;
  bad_lexical_cast *anon_var_0;
  undefined1 local_38 [8];
  string tmp;
  istringstream *iss_local;
  
  tmp.field_2._8_8_ = iss;
  std::__cxx11::istringstream::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"nan");
  if (bVar1) {
    iss_local = (istringstream *)std::numeric_limits<double>::quiet_NaN();
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"inf");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"+inf");
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"-inf");
        if (bVar1) {
          dVar2 = std::numeric_limits<double>::infinity();
          iss_local = (istringstream *)(dVar2 * -1.0);
        }
        else {
          iss_local = (istringstream *)
                      boost::lexical_cast<double,std::__cxx11::string>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_38);
        }
        goto LAB_001382b1;
      }
    }
    iss_local = (istringstream *)std::numeric_limits<double>::infinity();
  }
LAB_001382b1:
  std::__cxx11::string::~string((string *)local_38);
  return (double)iss_local;
}

Assistant:

inline static double cast(std::istringstream &iss) {
    std::string tmp(iss.str());

    if (tmp == "nan")
      return std::numeric_limits<double>::quiet_NaN();
    else if (tmp == "inf" || tmp == "+inf")
      return std::numeric_limits<double>::infinity();
    else if (tmp == "-inf")
      return -1. * std::numeric_limits<double>::infinity();

    try {
      return boost::lexical_cast<double>(tmp);
    } catch (boost::bad_lexical_cast &) {
      boost::format fmt("failed to serialize %s (to double)");
      fmt % tmp;
      throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
    }
  }